

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicseffect.cpp
# Opt level: O2

void QGraphicsEffect::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  void *pvVar1;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      update((QGraphicsEffect *)_o);
      return;
    }
    if (_id == 1) {
      pvVar1 = _a[1];
LAB_003755a0:
      setEnabled((QGraphicsEffect *)_o,*pvVar1);
      return;
    }
    if (_id == 0) {
      enabledChanged((QGraphicsEffect *)_o,*_a[1]);
      return;
    }
    break;
  case ReadProperty:
    if (_id == 0) {
      *(byte *)*_a = *(byte *)(*(long *)(_o + 8) + 0xa0) & 1;
      return;
    }
    break;
  case WriteProperty:
    if (_id == 0) {
      pvVar1 = *_a;
      goto LAB_003755a0;
    }
    break;
  case IndexOfMethod:
    QtMocHelpers::indexOfMethod<void(QGraphicsEffect::*)(bool)>
              ((QtMocHelpers *)_a,(void **)enabledChanged,0,0);
    return;
  }
  return;
}

Assistant:

void QGraphicsEffect::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsEffect *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->enabledChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->setEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->update(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsEffect::*)(bool )>(_a, &QGraphicsEffect::enabledChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEnabled(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}